

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.c
# Opt level: O2

void small_class_create(small_class *sc,uint granularity,float desired_factor,uint min_alloc,
                       float *actual_factor)

{
  uint uVar1;
  ulong uVar2;
  char *__assertion;
  float fVar3;
  
  if (granularity == 0) {
    __assertion = "granularity > 0";
    uVar1 = 0x29;
  }
  else if ((granularity & granularity - 1) == 0) {
    if (desired_factor <= 1.0) {
      __assertion = "desired_factor > 1.f";
      uVar1 = 0x2b;
    }
    else if (2.0 < desired_factor) {
      __assertion = "desired_factor <= 2.f";
      uVar1 = 0x2c;
    }
    else if (min_alloc == 0) {
      __assertion = "min_alloc > 0";
      uVar1 = 0x2d;
    }
    else {
      if (actual_factor != (float *)0x0) {
        sc->granularity = granularity;
        uVar1 = 0;
        if (granularity != 0) {
          for (; (granularity >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        sc->ignore_bits_count = uVar1;
        fVar3 = logf(desired_factor);
        fVar3 = logf(0.6931472 / fVar3);
        uVar2 = (ulong)(fVar3 / 0.6931472 + 0.5);
        uVar1 = 1 << ((byte)uVar2 & 0x1f);
        sc->effective_bits = (uint)uVar2;
        sc->effective_size = uVar1;
        sc->effective_mask = uVar1 - 1;
        sc->size_shift = min_alloc - granularity;
        sc->size_shift_plus_1 = (min_alloc - granularity) + 1;
        fVar3 = exp2f((float)(uVar2 & 0xffffffff));
        fVar3 = exp2f(1.0 / fVar3);
        sc->actual_factor = fVar3;
        *actual_factor = fVar3;
        return;
      }
      __assertion = "actual_factor != NULL";
      uVar1 = 0x2e;
    }
  }
  else {
    __assertion = "(granularity & (granularity - 1)) == 0";
    uVar1 = 0x2a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                ,uVar1,
                "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
               );
}

Assistant:

void
small_class_create(struct small_class *sc, unsigned granularity,
		   float desired_factor, unsigned min_alloc, float *actual_factor)
{
	assert(granularity > 0); /* size cannot be multiple of zero. */
	assert((granularity & (granularity - 1)) == 0); /* must power of 2. */
	assert(desired_factor > 1.f);
	assert(desired_factor <= 2.f);
	assert(min_alloc > 0); /* Cannot allocate zero. */
	assert(actual_factor != NULL);

	sc->granularity = granularity;
	sc->ignore_bits_count = __builtin_ctz(granularity);
	float log2 = logf(2);
	sc->effective_bits = (unsigned)(logf(log2 / logf(desired_factor)) / log2 + .5);
	sc->effective_size = 1u << sc->effective_bits;
	sc->effective_mask = sc->effective_size - 1u;
	sc->size_shift = min_alloc - granularity;
	sc->size_shift_plus_1 = sc->size_shift + 1;

	sc->actual_factor = powf(2, 1.f / powf(2, sc->effective_bits));
	*actual_factor = sc->actual_factor;
}